

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O1

void __thiscall
perfetto::DataSource<perfetto::TrackEvent,_perfetto::internal::TrackEventDataSourceTraits>::
TraceContext::~TraceContext(TraceContext *this)

{
  _Any_data local_28;
  code *local_18;
  undefined8 uStack_10;
  
  if (this->tls_inst_->is_intercepted == true) {
    local_18 = (code *)0x0;
    uStack_10 = 0;
    local_28._M_unused._M_object = (void *)0x0;
    local_28._8_8_ = 0;
    Flush(this,(function<void_()> *)&local_28);
    if (local_18 != (code *)0x0) {
      (*local_18)(&local_28,&local_28,__destroy_functor);
    }
  }
  return;
}

Assistant:

~TraceContext() {
      // If the data source is being intercepted, flush the trace writer after
      // each trace point to make sure the interceptor sees the data right away.
      if (PERFETTO_UNLIKELY(tls_inst_->is_intercepted))
        Flush();
    }